

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPoolInline.h
# Opt level: O2

void sbfPool_put(void *data)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  lVar2 = *(long *)((long)data + -0x10);
  LOCK();
  piVar1 = (int *)(*(long *)(lVar2 + 0x28) + 0x1c);
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  do {
    lVar3 = *(long *)(lVar2 + 0x20);
    *(long *)((long)data + -8) = lVar3;
    LOCK();
    bVar4 = lVar3 == *(long *)(lVar2 + 0x20);
    if (bVar4) {
      *(long *)(lVar2 + 0x20) = (long)data + -0x10;
    }
    UNLOCK();
  } while (!bVar4);
  return;
}

Assistant:

static SBF_INLINE void
sbfPool_put (void* data)
{
    sbfPoolItem item = (sbfPoolItem)data - 1;
    sbfPool     pool = item->mPool;

#ifdef WIN32
    InterlockedIncrement (&pool->mCount->mPuts);
#else
    __sync_fetch_and_add (&pool->mCount->mPuts, 1);
#endif

    do
        item->mNext = pool->mFree;
    while (!sbfAtomic_compareAndSwap ((volatile int64_t*)&pool->mFree,
                                      (int64_t)item->mNext,
                                      (int64_t)item));
}